

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O1

QIcon __thiscall QGnomeTheme::fileIcon(QGnomeTheme *this,QFileInfo *fileInfo,IconOptions param_2)

{
  undefined4 in_register_00000014;
  
  QGenericUnixTheme::xdgFileIcon
            (&this->super_QGenericUnixTheme,
             (QFileInfo *)
             CONCAT44(in_register_00000014,
                      param_2.super_QFlagsStorageHelper<QPlatformTheme::IconOption,_4>.
                      super_QFlagsStorage<QPlatformTheme::IconOption>.i));
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QGnomeTheme::fileIcon(const QFileInfo &fileInfo, QPlatformTheme::IconOptions) const
{
#if QT_CONFIG(mimetype)
    return xdgFileIcon(fileInfo);
#else
    Q_UNUSED(fileInfo);
    return QIcon();
#endif
}